

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<unsigned_long>_> * __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *this,
          linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<unsigned_long>const>::
    copy<testing::MatcherInterface<unsigned_long>const>
              ((linked_ptr<testing::MatcherInterface<unsigned_long>const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }